

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O3

void __thiscall EnvironmentNAVXYTHETALAT::InitializeEnvironment(EnvironmentNAVXYTHETALAT *this)

{
  pointer ppEVar1;
  EnvNAVXYTHETALATHashEntry_t **ppEVar2;
  long lVar3;
  undefined8 *puVar4;
  int *piVar5;
  code *pcVar6;
  ulong uVar7;
  long lVar8;
  long *plVar9;
  int iVar10;
  ulong uVar11;
  
  uVar11 = (long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.NumThetaDirs *
           (long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EnvHeight_c *
           (long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EnvWidth_c;
  iVar10 = (int)uVar11;
  if (iVar10 < 0x5f5e101) {
    uVar7 = 0xffffffffffffffff;
    if (-1 < iVar10) {
      uVar7 = uVar11 * 8;
    }
    ppEVar2 = (EnvNAVXYTHETALATHashEntry_t **)operator_new__(uVar7);
    this->Coord2StateIDHashTable_lookup = ppEVar2;
    if (0 < iVar10) {
      uVar7 = 0;
      do {
        this->Coord2StateIDHashTable_lookup[uVar7] = (EnvNAVXYTHETALATHashEntry_t *)0x0;
        uVar7 = uVar7 + 1;
      } while ((uVar11 & 0xffffffff) != uVar7);
    }
    this->GetHashEntry = 0x2e1;
    *(undefined8 *)&this->field_0x1c8 = 0;
    this->CreateNewHashEntry = 0x2e9;
    *(undefined8 *)&this->field_0x1d8 = 0;
    this->HashTableSize = 0;
    lVar3 = 0x2e1;
    lVar8 = 0x198;
  }
  else {
    this->HashTableSize = 0x400000;
    puVar4 = (undefined8 *)operator_new__(0x6000008);
    *puVar4 = 0x400000;
    memset((vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_> *)
           (puVar4 + 1),0,0x6000000);
    this->Coord2StateIDHashTable =
         (vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_> *)
         (puVar4 + 1);
    this->GetHashEntry = 0x2d1;
    *(undefined8 *)&this->field_0x1c8 = 0;
    this->CreateNewHashEntry = 0x2d9;
    *(undefined8 *)&this->field_0x1d8 = 0;
    lVar3 = 0x2d1;
    lVar8 = 0x1b8;
  }
  *(undefined8 *)
   ((long)&(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
           _vptr_DiscreteSpaceInformation + lVar8) = 0;
  ppEVar1 = (this->StateID2CoordTable).
            super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->StateID2CoordTable).
      super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar1) {
    (this->StateID2CoordTable).
    super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppEVar1;
  }
  piVar5 = (int *)(**(code **)((long)(this->super_EnvironmentNAVXYTHETALATTICE).
                                     super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                              lVar3 + -1))
                            (this,(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                                  StartX_c,
                             (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.StartY_c
                             ,(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                              StartTheta);
  if (piVar5 == (int *)0x0) {
    pcVar6 = (code *)this->CreateNewHashEntry;
    plVar9 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                             super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                     *(long *)&this->field_0x1d8);
    if (((ulong)pcVar6 & 1) != 0) {
      pcVar6 = *(code **)(pcVar6 + *plVar9 + -1);
    }
    piVar5 = (int *)(*pcVar6)(plVar9,(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                                     StartX_c,
                              (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                              StartY_c,(this->super_EnvironmentNAVXYTHETALATTICE).
                                       EnvNAVXYTHETALATCfg.StartTheta);
  }
  (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALAT.startstateid = *piVar5;
  pcVar6 = (code *)this->GetHashEntry;
  plVar9 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation
                           ._vptr_DiscreteSpaceInformation + *(long *)&this->field_0x1c8);
  if (((ulong)pcVar6 & 1) != 0) {
    pcVar6 = *(code **)(pcVar6 + *plVar9 + -1);
  }
  piVar5 = (int *)(*pcVar6)(plVar9,(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                                   EndX_c,
                            (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EndY_c,
                            (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EndTheta)
  ;
  if (piVar5 == (int *)0x0) {
    pcVar6 = (code *)this->CreateNewHashEntry;
    plVar9 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                             super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                     *(long *)&this->field_0x1d8);
    if (((ulong)pcVar6 & 1) != 0) {
      pcVar6 = *(code **)(pcVar6 + *plVar9 + -1);
    }
    piVar5 = (int *)(*pcVar6)(plVar9,(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                                     EndX_c,
                              (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EndY_c,
                              (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                              EndTheta);
  }
  (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALAT.goalstateid = *piVar5;
  (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALAT.bInitialized = true;
  return;
}

Assistant:

void EnvironmentNAVXYTHETALAT::InitializeEnvironment()
{
    EnvNAVXYTHETALATHashEntry_t* HashEntry;

    int maxsize = EnvNAVXYTHETALATCfg.EnvWidth_c * EnvNAVXYTHETALATCfg.EnvHeight_c * EnvNAVXYTHETALATCfg.NumThetaDirs;

    if (maxsize <= SBPL_XYTHETALAT_MAXSTATESFORLOOKUP) {
        SBPL_PRINTF("environment stores states in lookup table\n");

        Coord2StateIDHashTable_lookup = new EnvNAVXYTHETALATHashEntry_t*[maxsize];
        for (int i = 0; i < maxsize; i++) {
            Coord2StateIDHashTable_lookup[i] = NULL;
        }
        GetHashEntry = &EnvironmentNAVXYTHETALAT::GetHashEntry_lookup;
        CreateNewHashEntry = &EnvironmentNAVXYTHETALAT::CreateNewHashEntry_lookup;

        // not using hash table
        HashTableSize = 0;
        Coord2StateIDHashTable = NULL;
    }
    else {
        SBPL_PRINTF("environment stores states in hashtable\n");

        // initialize the map from Coord to StateID
        HashTableSize = 4 * 1024 * 1024; // should be power of two
        Coord2StateIDHashTable = new std::vector<EnvNAVXYTHETALATHashEntry_t*>[HashTableSize];
        GetHashEntry = &EnvironmentNAVXYTHETALAT::GetHashEntry_hash;
        CreateNewHashEntry = &EnvironmentNAVXYTHETALAT::CreateNewHashEntry_hash;

        // not using hash
        Coord2StateIDHashTable_lookup = NULL;
    }

    // initialize the map from StateID to Coord
    StateID2CoordTable.clear();

    // create start state
    if (NULL == (HashEntry = (this->*GetHashEntry)(
            EnvNAVXYTHETALATCfg.StartX_c,
            EnvNAVXYTHETALATCfg.StartY_c,
            EnvNAVXYTHETALATCfg.StartTheta)))
    {
        // have to create a new entry
        HashEntry = (this->*CreateNewHashEntry)(
                EnvNAVXYTHETALATCfg.StartX_c,
                EnvNAVXYTHETALATCfg.StartY_c,
                EnvNAVXYTHETALATCfg.StartTheta);
    }
    EnvNAVXYTHETALAT.startstateid = HashEntry->stateID;

    // create goal state
    if ((HashEntry = (this->*GetHashEntry)(
            EnvNAVXYTHETALATCfg.EndX_c,
            EnvNAVXYTHETALATCfg.EndY_c,
            EnvNAVXYTHETALATCfg.EndTheta)) == NULL)
    {
        // have to create a new entry
        HashEntry = (this->*CreateNewHashEntry)(
                EnvNAVXYTHETALATCfg.EndX_c,
                EnvNAVXYTHETALATCfg.EndY_c,
                EnvNAVXYTHETALATCfg.EndTheta);
    }
    EnvNAVXYTHETALAT.goalstateid = HashEntry->stateID;

    // initialized
    EnvNAVXYTHETALAT.bInitialized = true;
}